

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_pointer.cc
# Opt level: O3

void simple_map(void)

{
  char *pcVar1;
  ulong uVar2;
  slot_type *psVar3;
  uint uVar4;
  ushort uVar5;
  byte bVar6;
  char cVar7;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  *this;
  size_t i;
  MappedReference<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>_> pLVar8;
  ostream *this_00;
  long *plVar9;
  ulong hashval;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  __m128i match;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  *local_80;
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  local_78;
  in_place_interface local_50;
  segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  **local_30;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  
  local_50._vptr_in_place_interface =
       (_func_int **)CONCAT44(local_50._vptr_in_place_interface._4_4_,0x1a4);
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::basic_managed_mapped_file(&local_78,"map_iv.dat",1000000,0,&local_50);
  local_30 = &local_80;
  local_80 = local_78.
             super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
             .mp_header;
  local_50.alignment = 8;
  local_50.size = 0x38;
  local_50.type_name =
       "N5phmap13flat_hash_mapIKmZ10simple_mapvE7LatpLonSt4hashImESt8equal_toImEN5boost12interprocess9allocatorISt4pairIS1_S2_ENS8_15segment_managerIcNS8_15rbtree_best_fitINS8_12mutex_familyENS8_10offset_ptrIvlmLm0EEELm0EEENS8_10iset_indexEEEEEEE"
  ;
  local_50._vptr_in_place_interface = (_func_int **)&PTR_construct_n_0011bc68;
  this = (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
          *)boost::interprocess::
            segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
            ::priv_generic_construct
                      (local_78.
                       super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
                       .mp_header,"node_store",1,true,true,&local_50);
  uVar14 = 0;
  do {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar14;
    hashval = SUB168(auVar15 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar15 * ZEXT816(0xde5fb9d2630458e9),0);
    bVar6 = (byte)hashval;
    if (this->ctrl_ != (ctrl_t *)0x0) {
      uVar2 = this->capacity_;
      if ((uVar2 + 1 & uVar2) != 0) {
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
      }
      uVar10 = hashval >> 7;
      auVar15 = ZEXT216(CONCAT11(bVar6,bVar6) & 0x7f7f);
      auVar15 = pshuflw(auVar15,auVar15,0);
      lVar11 = 0;
      while( true ) {
        uVar10 = uVar10 & uVar2;
        pcVar1 = this->ctrl_ + uVar10;
        cVar7 = pcVar1[0xf];
        cVar17 = auVar15[0];
        auVar18[0] = -(cVar17 == *pcVar1);
        cVar19 = auVar15[1];
        auVar18[1] = -(cVar19 == pcVar1[1]);
        cVar20 = auVar15[2];
        auVar18[2] = -(cVar20 == pcVar1[2]);
        cVar21 = auVar15[3];
        auVar18[3] = -(cVar21 == pcVar1[3]);
        auVar18[4] = -(cVar17 == pcVar1[4]);
        auVar18[5] = -(cVar19 == pcVar1[5]);
        auVar18[6] = -(cVar20 == pcVar1[6]);
        auVar18[7] = -(cVar21 == pcVar1[7]);
        auVar18[8] = -(cVar17 == pcVar1[8]);
        auVar18[9] = -(cVar19 == pcVar1[9]);
        auVar18[10] = -(cVar20 == pcVar1[10]);
        auVar18[0xb] = -(cVar21 == pcVar1[0xb]);
        auVar18[0xc] = -(cVar17 == pcVar1[0xc]);
        auVar18[0xd] = -(cVar19 == pcVar1[0xd]);
        auVar18[0xe] = -(cVar20 == pcVar1[0xe]);
        auVar18[0xf] = -(cVar21 == cVar7);
        uVar5 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
        if (uVar5 != 0) {
          uVar12 = (uint)uVar5;
          do {
            uVar4 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            uVar13 = uVar4 + uVar10 & uVar2;
            if (this->slots_[uVar13].value.first == uVar14) {
              if (uVar13 == 0xffffffffffffffff) goto LAB_00102681;
              goto LAB_001026af;
            }
            uVar12 = uVar12 - 1 & uVar12;
          } while (uVar12 != 0);
        }
        auVar16[0] = -(*pcVar1 == -0x80);
        auVar16[1] = -(pcVar1[1] == -0x80);
        auVar16[2] = -(pcVar1[2] == -0x80);
        auVar16[3] = -(pcVar1[3] == -0x80);
        auVar16[4] = -(pcVar1[4] == -0x80);
        auVar16[5] = -(pcVar1[5] == -0x80);
        auVar16[6] = -(pcVar1[6] == -0x80);
        auVar16[7] = -(pcVar1[7] == -0x80);
        auVar16[8] = -(pcVar1[8] == -0x80);
        auVar16[9] = -(pcVar1[9] == -0x80);
        auVar16[10] = -(pcVar1[10] == -0x80);
        auVar16[0xb] = -(pcVar1[0xb] == -0x80);
        auVar16[0xc] = -(pcVar1[0xc] == -0x80);
        auVar16[0xd] = -(pcVar1[0xd] == -0x80);
        auVar16[0xe] = -(pcVar1[0xe] == -0x80);
        auVar16[0xf] = -(cVar7 == -0x80);
        if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar7 == -0x80)
        break;
        uVar10 = uVar10 + lVar11 + 0x10;
        lVar11 = lVar11 + 0x10;
      }
    }
LAB_00102681:
    i = phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
        ::prepare_insert(this,hashval);
    psVar3 = this->slots_;
    psVar3[i].value.first = uVar14;
    *(undefined8 *)((long)psVar3 + i * 0x10 + 8) = 0xa0000000a;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
    ::set_ctrl(this,i,bVar6 & 0x7f);
LAB_001026af:
    uVar14 = uVar14 + 1;
    if (uVar14 == 1000) {
      pLVar8 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               ::
               at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                           *)this,(key_arg<const_unsigned_long> *)0xa);
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pLVar8->latp);
      std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
      pLVar8 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               ::
               at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                           *)this,(key_arg<const_unsigned_long> *)0xa);
      plVar9 = (long *)std::ostream::operator<<(this_00,pLVar8->lon);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      boost::interprocess::ipcdetail::
      managed_open_or_create_impl<boost::interprocess::ipcdetail::file_wrapper,_16UL,_true,_false>::
      ~managed_open_or_create_impl(&local_78.m_mfile);
      return;
    }
  } while( true );
}

Assistant:

void simple_map() {
   struct LatpLon {
      int32_t latp;
      int32_t lon;
   };

   using nodestore_pair_t = std::pair<const uint64_t, LatpLon>;
   using map_t            = phmap::flat_hash_map<const uint64_t, LatpLon, std::hash<uint64_t>, std::equal_to<uint64_t>,
                                                 bi_alloc_t<nodestore_pair_t>>;

   auto mmap_file =
      boost::interprocess::managed_mapped_file(boost::interprocess::open_or_create, "map_iv.dat", 1000000);
   map_t* map = mmap_file.find_or_construct<map_t>("node_store")(mmap_file.get_segment_manager());

   for (unsigned int i = 0; i < 1000; ++i) {
      LatpLon p = {10, 10};
      map->emplace(i, p);
   }

   std::cout << map->at(10).latp << " " << map->at(10).lon << std::endl;
}